

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void wallet::wallet_tests::TestLoadWallet
               (string *name,DatabaseFormat format,
               function<void_(std::shared_ptr<wallet::CWallet>)> f)

{
  long lVar1;
  undefined8 uVar2;
  long in_RDX;
  char *pcVar3;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *__args_2;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined4 local_2c8;
  DBErrors local_2c4;
  lazy_ostream local_2c0;
  undefined1 *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain;
  NodeContext node;
  undefined1 *local_138;
  element_type *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  undefined1 *local_120;
  undefined1 **local_118;
  DBErrors *local_110;
  char *local_108;
  char *local_100;
  assertion_result local_f8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  bilingual_str error;
  DatabaseOptions options;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::NodeContext::NodeContext(&node);
  interfaces::MakeChain((interfaces *)&chain,&node);
  options.require_existing = false;
  options.require_create = false;
  options.create_flags = 0;
  options.create_passphrase._M_dataplus._M_p = (pointer)&options.create_passphrase.field_2;
  options.create_passphrase._M_string_length = 0;
  options.create_passphrase.field_2._M_local_buf[0] = '\0';
  options.verify = true;
  options.use_unsafe_sync = false;
  options.use_shared_memory = false;
  options.max_log_mb = 100;
  options.require_format.super__Optional_base<wallet::DatabaseFormat,_true,_true>._M_payload.
  super__Optional_payload_base<wallet::DatabaseFormat> =
       (_Optional_base<wallet::DatabaseFormat,_true,_true>)((ulong)format | 0x100000000);
  error.original._M_dataplus._M_p = (pointer)&error.original.field_2;
  error.original._M_string_length = 0;
  error.original.field_2._M_local_buf[0] = '\0';
  error.translated._M_dataplus._M_p = (pointer)&error.translated.field_2;
  error.translated._M_string_length = 0;
  error.translated.field_2._M_local_buf[0] = '\0';
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  warnings.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  MakeWalletDatabase((wallet *)&database,name,&options,&status,&error);
  criticalblock43.super_unique_lock._M_device =
       (mutex_type *)
       chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
       _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
       super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __args_2 = &database;
  pcVar3 = "";
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::CWallet,std::allocator<wallet::CWallet>,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CWallet **)&wallet,(allocator<wallet::CWallet> *)&local_130,(Chain **)&criticalblock43
             ,(char (*) [1])0xf6cf21,__args_2);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1c9;
  file.m_begin = (iterator)&local_290;
  msg.m_end = (iterator)__args_2;
  msg.m_begin = pcVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a0,msg);
  local_2c0.m_empty = false;
  local_2c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_2b0 = boost::unit_test::lazy_ostream::inst;
  local_2a8 = "";
  local_2c4 = CWallet::LoadWallet(wallet.
                                  super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
  local_110 = &local_2c4;
  local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_2c4 == LOAD_OK);
  local_2c8 = 0;
  local_f8.m_message.px = (element_type *)0x0;
  local_f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_100 = "";
  criticalblock43.super_unique_lock._M_owns = false;
  criticalblock43.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013b3078;
  local_118 = &local_138;
  local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((ulong)local_128 & 0xffffffffffffff00);
  local_130 = (element_type *)&PTR__lazy_ostream_013b3078;
  local_120 = boost::unit_test::lazy_ostream::inst;
  local_138 = (undefined1 *)&local_2c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_f8,&local_2c0,1,2,REQUIRE,0xf8747a,(size_t)&local_108,0x1c9,&criticalblock43,
             "DBErrors::LOAD_OK",&local_130);
  boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
  criticalblock43.super_unique_lock._M_device =
       &((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cs_wallet)
        .super_recursive_mutex;
  criticalblock43.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
  local_130 = wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_128 = wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if (*(long *)(in_RDX + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      uVar2 = std::__throw_bad_function_call();
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
      if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
          database._M_t.
          super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
          ._M_t.
          super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
          .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)0x0
         ) {
        (**(code **)(*(long *)database._M_t.
                              super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                              .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
                    8))();
      }
      database._M_t.
      super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
      _M_t.
      super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
      .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
           (__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
            )(__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
             0x0;
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings);
      bilingual_str::~bilingual_str(&error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
           *)options.create_passphrase._M_dataplus._M_p != &options.create_passphrase.field_2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::
        _M_destroy(&options.create_passphrase,
                   CONCAT71(options.create_passphrase.field_2._M_allocated_capacity._1_7_,
                            options.create_passphrase.field_2._M_local_buf[0]));
      }
      if ((__uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
          chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)0x0) {
        (**(code **)(*(long *)chain._M_t.
                              super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                              .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl + 8))
                  ();
      }
      chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
      _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
      super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
           (__uniq_ptr_data<interfaces::Chain,_std::default_delete<interfaces::Chain>,_true,_true>)
           (__uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)0x0;
      ::node::NodeContext::~NodeContext(&node);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        _Unwind_Resume(uVar2);
      }
    }
  }
  else {
    (**(code **)(in_RDX + 0x18))();
    if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
    if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
        database._M_t.
        super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
        .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)0x0)
    {
      (**(code **)(*(long *)database._M_t.
                            super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                            .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl + 8
                  ))();
    }
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&warnings);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.translated._M_dataplus._M_p != &error.translated.field_2) {
      operator_delete(error.translated._M_dataplus._M_p,
                      CONCAT71(error.translated.field_2._M_allocated_capacity._1_7_,
                               error.translated.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.original._M_dataplus._M_p != &error.original.field_2) {
      operator_delete(error.original._M_dataplus._M_p,
                      CONCAT71(error.original.field_2._M_allocated_capacity._1_7_,
                               error.original.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>_11
         *)options.create_passphrase._M_dataplus._M_p != &options.create_passphrase.field_2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_secure_allocator<char>_>::_M_destroy
                (&options.create_passphrase,
                 CONCAT71(options.create_passphrase.field_2._M_allocated_capacity._1_7_,
                          options.create_passphrase.field_2._M_local_buf[0]));
    }
    if ((__uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
        chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
        ._M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
        super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)0x0) {
      (**(code **)(*(long *)chain._M_t.
                            super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                            .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl + 8))();
    }
    ::node::NodeContext::~NodeContext(&node);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void TestLoadWallet(const std::string& name, DatabaseFormat format, std::function<void(std::shared_ptr<CWallet>)> f)
{
    node::NodeContext node;
    auto chain{interfaces::MakeChain(node)};
    DatabaseOptions options;
    options.require_format = format;
    DatabaseStatus status;
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto database{MakeWalletDatabase(name, options, status, error)};
    auto wallet{std::make_shared<CWallet>(chain.get(), "", std::move(database))};
    BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
    WITH_LOCK(wallet->cs_wallet, f(wallet));
}